

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,TPZGeoElRefLess<pzgeom::TPZGeoPoint> *gel)

{
  long in_RSI;
  TPZGeoEl *in_RDI;
  TPZGeoElSide *in_stack_00000028;
  TPZGeoElSide *in_stack_00000030;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  int i;
  TPZGeoEl *in_stack_ffffffffffffff30;
  TPZGeoPoint *in_stack_ffffffffffffff38;
  TPZGeoMesh *in_stack_ffffffffffffff40;
  TPZGeoElSideIndex *in_stack_ffffffffffffff48;
  TPZGeoMesh *in_stack_ffffffffffffff50;
  int64_t *local_80;
  int local_30;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoPoint>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024430d8);
  TPZGeoEl::TPZGeoEl((TPZGeoEl *)in_stack_ffffffffffffff40,(void **)in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff30);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02442dc0;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02442dc0;
  pzgeom::TPZGeoPoint::TPZGeoPoint
            ((TPZGeoPoint *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_80 = &in_RDI[1].fId;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex((TPZGeoElSideIndex *)in_stack_ffffffffffffff30);
    local_80 = local_80 + 3;
  } while (local_80 != &in_RDI[1].fFatherIndex);
  for (local_30 = 0; local_30 < 1; local_30 = local_30 + 1) {
    TPZGeoEl::Mesh(in_RDI);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff48 = (TPZGeoElSideIndex *)(in_RSI + 0x50 + (long)local_30 * 0x18);
    in_stack_ffffffffffffff50 = TPZGeoEl::Mesh(in_RDI);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    TPZGeoElSide::SetConnectivity(in_stack_00000030,in_stack_00000028);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bbd5d2);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bbd5df);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}